

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O1

void __thiscall jrtplib::RTCPScheduler::Reset(RTCPScheduler *this)

{
  this->headeroverhead = 0;
  this->hassentrtcp = false;
  this->firstcall = true;
  this->avgrtcppacksize = 1000;
  this->byescheduled = false;
  this->sendbyenow = false;
  return;
}

Assistant:

void RTCPScheduler::Reset()
{
	headeroverhead = 0; // user has to set this to an appropriate value
	hassentrtcp = false;
	firstcall = true;
	avgrtcppacksize = 1000; // TODO: what is a good value for this?
	byescheduled = false;
	sendbyenow = false;
}